

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall wasm::Wasm2JSBuilder::addMemoryGrowFunc(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  pointer puVar1;
  char *pcVar2;
  ValueBuilder *this_00;
  size_t sVar3;
  ValueBuilder *this_01;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  Ref RVar7;
  Ref *pRVar8;
  Value *pVVar9;
  Ref RVar10;
  Value *pVVar11;
  Ref block;
  Value *pVVar12;
  Ref RVar13;
  undefined1 uVar14;
  char *in_RCX;
  void *pvVar15;
  Ref in_R8;
  string_view sVar16;
  string_view sVar17;
  IString arg;
  IString op;
  IString name;
  IString op_00;
  IString name_00;
  IString op_01;
  IString op_02;
  IString op_03;
  IString name_01;
  IString name_02;
  IString key;
  IString op_04;
  IString op_05;
  IString op_06;
  IString op_07;
  IString op_08;
  IString op_09;
  IString op_10;
  IString op_11;
  IString op_12;
  IString op_13;
  IString op_14;
  IString name_03;
  IString target;
  IString target_00;
  IString target_01;
  Ref local_70;
  Ref memoryGrowFunc;
  
  name_03.str._M_str = (char *)wasm;
  name_03.str._M_len = DAT_010b0fd8;
  RVar7 = cashew::ValueBuilder::makeFunction(WASM_MEMORY_GROW,name_03);
  local_70 = RVar7;
  sVar16 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe416e0),SUB81(in_RCX,0));
  arg.str._M_len = sVar16._M_str;
  arg.str._M_str = in_RCX;
  cashew::ValueBuilder::appendArgumentToFunction
            ((ValueBuilder *)RVar7.inst,(Value *)sVar16._M_len,arg);
  uVar14 = SUB81(in_RCX,0);
  pRVar8 = cashew::Ref::operator[](&local_70,3);
  pVVar11 = pRVar8->inst;
  sVar16 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe416e0),(bool)uVar14);
  pvVar15 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar15);
  pVVar9->type = String;
  (pVVar9->field_1).str.str = sVar16;
  sVar3 = DAT_010b1770;
  RVar7.inst = cashew::SET.inst;
  sVar16 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe416e0),SUB81(cashew::SET.inst,0)
                            );
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = String;
  ((RVar10.inst)->field_1).str.str = sVar16;
  RVar10 = makeJsCoercion(RVar10,JS_INT);
  op.str._M_str = (char *)RVar10.inst;
  op.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar9,RVar7,op,in_R8);
  uVar14 = SUB81(RVar10.inst,0);
  cashew::Value::push_back(pVVar11,RVar7);
  RVar7 = cashew::ValueBuilder::makeVar(false);
  pRVar8 = cashew::Ref::operator[](&local_70,3);
  cashew::Value::push_back(pRVar8->inst,RVar7);
  sVar16 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe416eb),(bool)uVar14);
  target.str._M_str = sVar16._M_str;
  target.str._M_len = DAT_010b0fe8;
  RVar10 = cashew::ValueBuilder::makeCall(WASM_MEMORY_SIZE,target);
  RVar10 = makeJsCoercion(RVar10,JS_INT);
  name.str._M_str = (char *)RVar10.inst;
  name.str._M_len = (size_t)target.str._M_str;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar7.inst,(Value *)sVar16._M_len,name,in_R8);
  uVar14 = SUB81(RVar10.inst,0);
  RVar7 = cashew::ValueBuilder::makeVar(false);
  pRVar8 = cashew::Ref::operator[](&local_70,3);
  cashew::Value::push_back(pRVar8->inst,RVar7);
  sVar16 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe416f4),(bool)uVar14);
  name_00.str._M_len = sVar16._M_str;
  sVar17 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe416eb),(bool)uVar14);
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str = sVar17;
  sVar3 = DAT_010b14a0;
  memoryGrowFunc.inst = cashew::PLUS;
  sVar17 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe416e0),SUB81(cashew::PLUS,0));
  pvVar15 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar15);
  pVVar9->type = String;
  (pVVar9->field_1).str.str = sVar17;
  op_00.str._M_str = (char *)pVVar9;
  op_00.str._M_len = sVar3;
  RVar10 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,memoryGrowFunc,op_00,in_R8);
  RVar10 = makeJsCoercion(RVar10,JS_INT);
  name_00.str._M_str = (char *)RVar10.inst;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar7.inst,(Value *)sVar16._M_len,name_00,in_R8)
  ;
  uVar14 = SUB81(RVar10.inst,0);
  block = cashew::ValueBuilder::makeBlock();
  pRVar8 = cashew::Ref::operator[](&local_70,3);
  pVVar11 = pRVar8->inst;
  sVar16 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe416eb),(bool)uVar14);
  pvVar15 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar15);
  pVVar9->type = String;
  (pVVar9->field_1).str.str = sVar16;
  sVar3 = DAT_010b1510;
  RVar7.inst = cashew::LT.inst;
  sVar16 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe416f4),
                             SUB81(cashew::LT.inst,0));
  pvVar15 = (void *)0x18;
  pVVar12 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar12->type = Null;
  cashew::Value::free(pVVar12,pvVar15);
  pVVar12->type = String;
  (pVVar12->field_1).str.str = sVar16;
  op_01.str._M_str = (char *)pVVar12;
  op_01.str._M_len = sVar3;
  RVar10 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar9,RVar7,op_01,in_R8);
  bVar6 = SUB81(pVVar12,0);
  sVar16 = IString::interned((IString *)0x2,(string_view)ZEXT816(0xe416fd),bVar6);
  op_03.str._M_len = sVar16._M_str;
  memoryGrowFunc.inst = (Value *)sVar16._M_len;
  sVar16 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe416f4),bVar6);
  pvVar15 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar15);
  pVVar9->type = String;
  (pVVar9->field_1).str.str = sVar16;
  sVar3 = DAT_010b1510;
  RVar7.inst = cashew::LT.inst;
  pvVar15 = (void *)0x18;
  pVVar12 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar12->type = Null;
  cashew::Value::free(pVVar12,pvVar15);
  pVVar12->type = Number;
  (pVVar12->field_1).arr = (ArrayStorage *)0x40f0000000000000;
  op_02.str._M_str = (char *)pVVar12;
  op_02.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar9,RVar7,op_02,in_R8);
  op_03.str._M_str = (char *)RVar7.inst;
  RVar10 = cashew::ValueBuilder::makeBinary(RVar10.inst,memoryGrowFunc,op_03,in_R8);
  uVar14 = SUB81(RVar7.inst,0);
  RVar7 = cashew::ValueBuilder::makeIf(RVar10,block,(Ref)0x0);
  cashew::Value::push_back(pVVar11,RVar7);
  RVar7 = cashew::ValueBuilder::makeVar(false);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  sVar16 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe41700),(bool)uVar14);
  sVar4 = DAT_010b0ea8;
  this_01 = MATH_IMUL;
  sVar3 = DAT_010b0c68;
  this_00 = ARRAY_BUFFER;
  memoryGrowFunc.inst = (Value *)sVar16._M_str;
  sVar17 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe416f4),
                             SUB81(MATH_IMUL,0));
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str = sVar17;
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = Number;
  ((RVar10.inst)->field_1).arr = (ArrayStorage *)0x40f0000000000000;
  target_00.str._M_str = (char *)pVVar11;
  target_00.str._M_len = sVar4;
  RVar13 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>(this_01,target_00,RVar10,in_R8);
  target_01.str._M_str = (char *)RVar13.inst;
  target_01.str._M_len = sVar3;
  RVar10 = cashew::ValueBuilder::makeCall<cashew::Ref>(this_00,target_01,RVar10);
  RVar10 = cashew::ValueBuilder::makeNew(RVar10);
  name_01.str._M_str = (char *)RVar10.inst;
  name_01.str._M_len = (size_t)memoryGrowFunc.inst;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar7.inst,(Value *)sVar16._M_len,name_01,in_R8)
  ;
  uVar14 = SUB81(RVar10.inst,0);
  RVar7 = cashew::ValueBuilder::makeVar(false);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  sVar16 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe4170a),(bool)uVar14);
  pcVar2 = DAT_010b0be8;
  name_02.str._M_len = sVar16._M_str;
  memoryGrowFunc.inst = INT8ARRAY;
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = String;
  ((RVar10.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar10.inst)->field_1).str.str._M_str = pcVar2;
  sVar17 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe41700),(bool)uVar14);
  pvVar15 = (void *)0x18;
  RVar13.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar13.inst)->type = Null;
  cashew::Value::free(RVar13.inst,pvVar15);
  (RVar13.inst)->type = String;
  ((RVar13.inst)->field_1).str.str = sVar17;
  RVar10 = cashew::ValueBuilder::makeCall(RVar10,RVar13);
  RVar10 = cashew::ValueBuilder::makeNew(RVar10);
  name_02.str._M_str = (char *)RVar10.inst;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar7.inst,(Value *)sVar16._M_len,name_02,in_R8)
  ;
  sVar16 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe4170a),
                             SUB81(RVar10.inst,0));
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str = sVar16;
  sVar16 = IString::interned((IString *)0x3,(string_view)ZEXT816(0xe284fb),SUB81(RVar10.inst,0));
  key.str._M_len = sVar16._M_str;
  key.str._M_str = (char *)RVar10.inst;
  RVar7 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar11,(Value *)sVar16._M_len,key);
  pcVar2 = DAT_010b15d0;
  sVar3 = cashew::HEAP8;
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = String;
  ((RVar10.inst)->field_1).str.str._M_len = sVar3;
  ((RVar10.inst)->field_1).str.str._M_str = pcVar2;
  RVar7 = cashew::ValueBuilder::makeCall(RVar7,RVar10);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  pcVar5 = DAT_010b15d0;
  sVar3 = cashew::HEAP8;
  pcVar2 = DAT_010b0be8;
  memoryGrowFunc.inst = INT8ARRAY;
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str._M_len = sVar3;
  (pVVar11->field_1).str.str._M_str = pcVar5;
  sVar3 = DAT_010b1770;
  RVar7.inst = cashew::SET.inst;
  pvVar15 = (void *)0x18;
  RVar10.inst = cashew::SET.inst;
  RVar13.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  uVar14 = SUB81(RVar10.inst,0);
  (RVar13.inst)->type = Null;
  cashew::Value::free(RVar13.inst,pvVar15);
  (RVar13.inst)->type = String;
  ((RVar13.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar13.inst)->field_1).str.str._M_str = pcVar2;
  sVar16 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe41700),(bool)uVar14);
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = String;
  ((RVar10.inst)->field_1).str.str = sVar16;
  RVar10 = cashew::ValueBuilder::makeCall(RVar13,RVar10);
  RVar10 = cashew::ValueBuilder::makeNew(RVar10);
  op_04.str._M_str = (char *)RVar10.inst;
  op_04.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,RVar7,op_04,in_R8);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  pcVar5 = DAT_010b15e0;
  sVar3 = cashew::HEAP16;
  pcVar2 = DAT_010b0bf8;
  memoryGrowFunc.inst = INT16ARRAY;
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str._M_len = sVar3;
  (pVVar11->field_1).str.str._M_str = pcVar5;
  sVar3 = DAT_010b1770;
  RVar7.inst = cashew::SET.inst;
  pvVar15 = (void *)0x18;
  RVar10.inst = cashew::SET.inst;
  RVar13.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  uVar14 = SUB81(RVar10.inst,0);
  (RVar13.inst)->type = Null;
  cashew::Value::free(RVar13.inst,pvVar15);
  (RVar13.inst)->type = String;
  ((RVar13.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar13.inst)->field_1).str.str._M_str = pcVar2;
  sVar16 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe41700),(bool)uVar14);
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = String;
  ((RVar10.inst)->field_1).str.str = sVar16;
  RVar10 = cashew::ValueBuilder::makeCall(RVar13,RVar10);
  RVar10 = cashew::ValueBuilder::makeNew(RVar10);
  op_05.str._M_str = (char *)RVar10.inst;
  op_05.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,RVar7,op_05,in_R8);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  pcVar5 = DAT_010b15f0;
  sVar3 = cashew::HEAP32;
  pcVar2 = DAT_010b0c08;
  memoryGrowFunc.inst = INT32ARRAY;
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str._M_len = sVar3;
  (pVVar11->field_1).str.str._M_str = pcVar5;
  sVar3 = DAT_010b1770;
  RVar7.inst = cashew::SET.inst;
  pvVar15 = (void *)0x18;
  RVar10.inst = cashew::SET.inst;
  RVar13.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  uVar14 = SUB81(RVar10.inst,0);
  (RVar13.inst)->type = Null;
  cashew::Value::free(RVar13.inst,pvVar15);
  (RVar13.inst)->type = String;
  ((RVar13.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar13.inst)->field_1).str.str._M_str = pcVar2;
  sVar16 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe41700),(bool)uVar14);
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = String;
  ((RVar10.inst)->field_1).str.str = sVar16;
  RVar10 = cashew::ValueBuilder::makeCall(RVar13,RVar10);
  RVar10 = cashew::ValueBuilder::makeNew(RVar10);
  op_06.str._M_str = (char *)RVar10.inst;
  op_06.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,RVar7,op_06,in_R8);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  pcVar5 = DAT_010b1610;
  sVar3 = cashew::HEAPU8;
  pcVar2 = DAT_010b0c18;
  memoryGrowFunc.inst = UINT8ARRAY;
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str._M_len = sVar3;
  (pVVar11->field_1).str.str._M_str = pcVar5;
  sVar3 = DAT_010b1770;
  RVar7.inst = cashew::SET.inst;
  pvVar15 = (void *)0x18;
  RVar10.inst = cashew::SET.inst;
  RVar13.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  uVar14 = SUB81(RVar10.inst,0);
  (RVar13.inst)->type = Null;
  cashew::Value::free(RVar13.inst,pvVar15);
  (RVar13.inst)->type = String;
  ((RVar13.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar13.inst)->field_1).str.str._M_str = pcVar2;
  sVar16 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe41700),(bool)uVar14);
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = String;
  ((RVar10.inst)->field_1).str.str = sVar16;
  RVar10 = cashew::ValueBuilder::makeCall(RVar13,RVar10);
  RVar10 = cashew::ValueBuilder::makeNew(RVar10);
  op_07.str._M_str = (char *)RVar10.inst;
  op_07.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,RVar7,op_07,in_R8);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  pcVar5 = DAT_010b1620;
  sVar3 = cashew::HEAPU16;
  pcVar2 = DAT_010b0c28;
  memoryGrowFunc.inst = UINT16ARRAY;
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str._M_len = sVar3;
  (pVVar11->field_1).str.str._M_str = pcVar5;
  sVar3 = DAT_010b1770;
  RVar7.inst = cashew::SET.inst;
  pvVar15 = (void *)0x18;
  RVar10.inst = cashew::SET.inst;
  RVar13.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  uVar14 = SUB81(RVar10.inst,0);
  (RVar13.inst)->type = Null;
  cashew::Value::free(RVar13.inst,pvVar15);
  (RVar13.inst)->type = String;
  ((RVar13.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar13.inst)->field_1).str.str._M_str = pcVar2;
  sVar16 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe41700),(bool)uVar14);
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = String;
  ((RVar10.inst)->field_1).str.str = sVar16;
  RVar10 = cashew::ValueBuilder::makeCall(RVar13,RVar10);
  RVar10 = cashew::ValueBuilder::makeNew(RVar10);
  op_08.str._M_str = (char *)RVar10.inst;
  op_08.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,RVar7,op_08,in_R8);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  pcVar5 = DAT_010b1630;
  sVar3 = cashew::HEAPU32;
  pcVar2 = DAT_010b0c38;
  memoryGrowFunc.inst = UINT32ARRAY;
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str._M_len = sVar3;
  (pVVar11->field_1).str.str._M_str = pcVar5;
  sVar3 = DAT_010b1770;
  RVar7.inst = cashew::SET.inst;
  pvVar15 = (void *)0x18;
  RVar10.inst = cashew::SET.inst;
  RVar13.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  uVar14 = SUB81(RVar10.inst,0);
  (RVar13.inst)->type = Null;
  cashew::Value::free(RVar13.inst,pvVar15);
  (RVar13.inst)->type = String;
  ((RVar13.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar13.inst)->field_1).str.str._M_str = pcVar2;
  sVar16 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe41700),(bool)uVar14);
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = String;
  ((RVar10.inst)->field_1).str.str = sVar16;
  RVar10 = cashew::ValueBuilder::makeCall(RVar13,RVar10);
  RVar10 = cashew::ValueBuilder::makeNew(RVar10);
  op_09.str._M_str = (char *)RVar10.inst;
  op_09.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,RVar7,op_09,in_R8);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  pcVar5 = DAT_010b1600;
  sVar3 = cashew::HEAPF32;
  pcVar2 = DAT_010b0c48;
  memoryGrowFunc.inst = FLOAT32ARRAY;
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str._M_len = sVar3;
  (pVVar11->field_1).str.str._M_str = pcVar5;
  sVar3 = DAT_010b1770;
  RVar7.inst = cashew::SET.inst;
  pvVar15 = (void *)0x18;
  RVar10.inst = cashew::SET.inst;
  RVar13.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  uVar14 = SUB81(RVar10.inst,0);
  (RVar13.inst)->type = Null;
  cashew::Value::free(RVar13.inst,pvVar15);
  (RVar13.inst)->type = String;
  ((RVar13.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar13.inst)->field_1).str.str._M_str = pcVar2;
  sVar16 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe41700),(bool)uVar14);
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = String;
  ((RVar10.inst)->field_1).str.str = sVar16;
  RVar10 = cashew::ValueBuilder::makeCall(RVar13,RVar10);
  RVar10 = cashew::ValueBuilder::makeNew(RVar10);
  op_10.str._M_str = (char *)RVar10.inst;
  op_10.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,RVar7,op_10,in_R8);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  pcVar5 = DAT_010b1640;
  sVar3 = cashew::HEAPF64;
  pcVar2 = DAT_010b0c58;
  memoryGrowFunc.inst = FLOAT64ARRAY;
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str._M_len = sVar3;
  (pVVar11->field_1).str.str._M_str = pcVar5;
  sVar3 = DAT_010b1770;
  RVar7.inst = cashew::SET.inst;
  pvVar15 = (void *)0x18;
  RVar10.inst = cashew::SET.inst;
  RVar13.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  uVar14 = SUB81(RVar10.inst,0);
  (RVar13.inst)->type = Null;
  cashew::Value::free(RVar13.inst,pvVar15);
  (RVar13.inst)->type = String;
  ((RVar13.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar13.inst)->field_1).str.str._M_str = pcVar2;
  sVar16 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe41700),(bool)uVar14);
  pvVar15 = (void *)0x18;
  RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar10.inst)->type = Null;
  cashew::Value::free(RVar10.inst,pvVar15);
  (RVar10.inst)->type = String;
  ((RVar10.inst)->field_1).str.str = sVar16;
  RVar10 = cashew::ValueBuilder::makeCall(RVar13,RVar10);
  RVar10 = cashew::ValueBuilder::makeNew(RVar10);
  op_11.str._M_str = (char *)RVar10.inst;
  op_11.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,RVar7,op_11,in_R8);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  pcVar2 = DAT_010b0e48;
  sVar3 = BUFFER;
  pvVar15 = (void *)0x18;
  pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar11->type = Null;
  cashew::Value::free(pVVar11,pvVar15);
  pVVar11->type = String;
  (pVVar11->field_1).str.str._M_len = sVar3;
  (pVVar11->field_1).str.str._M_str = pcVar2;
  sVar3 = DAT_010b1770;
  RVar7.inst = cashew::SET.inst;
  sVar16 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe41700),
                             SUB81(cashew::SET.inst,0));
  pvVar15 = (void *)0x18;
  pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar9->type = Null;
  cashew::Value::free(pVVar9,pvVar15);
  pVVar9->type = String;
  (pVVar9->field_1).str.str = sVar16;
  op_12.str._M_str = (char *)pVVar9;
  op_12.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,RVar7,op_12,in_R8);
  uVar14 = SUB81(pVVar9,0);
  cashew::ValueBuilder::appendToBlock(block,RVar7);
  puVar1 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar1 != (wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (*(char **)((long)&(((puVar1->_M_t).
                          super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                          .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                        super_Importable).module + 8) != (char *)0x0)) {
    sVar16 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xe4cf4a),(bool)uVar14);
    pvVar15 = (void *)0x18;
    RVar7.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar7.inst)->type = Null;
    cashew::Value::free(RVar7.inst,pvVar15);
    (RVar7.inst)->type = String;
    ((RVar7.inst)->field_1).str.str = sVar16;
    pcVar2 = DAT_010b0e48;
    sVar3 = BUFFER;
    pvVar15 = (void *)0x18;
    RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar10.inst)->type = Null;
    cashew::Value::free(RVar10.inst,pvVar15);
    (RVar10.inst)->type = String;
    ((RVar10.inst)->field_1).str.str._M_len = sVar3;
    ((RVar10.inst)->field_1).str.str._M_str = pcVar2;
    RVar10 = cashew::ValueBuilder::makeDot(RVar7,RVar10);
    sVar4 = DAT_010b1770;
    RVar7.inst = cashew::SET.inst;
    pcVar2 = DAT_010b0e48;
    sVar3 = BUFFER;
    pvVar15 = (void *)0x18;
    pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    pVVar11->type = Null;
    cashew::Value::free(pVVar11,pvVar15);
    pVVar11->type = String;
    (pVVar11->field_1).str.str._M_len = sVar3;
    (pVVar11->field_1).str.str._M_str = pcVar2;
    op_13.str._M_str = (char *)pVVar11;
    op_13.str._M_len = sVar4;
    RVar7 = cashew::ValueBuilder::makeBinary(RVar10.inst,RVar7,op_13,in_R8);
    uVar14 = SUB81(pVVar11,0);
    cashew::ValueBuilder::appendToBlock(block,RVar7);
  }
  bVar6 = needsBufferView(wasm);
  if (bVar6) {
    sVar16 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe4161b),(bool)uVar14);
    pvVar15 = (void *)0x18;
    pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    pVVar11->type = Null;
    cashew::Value::free(pVVar11,pvVar15);
    pVVar11->type = String;
    (pVVar11->field_1).str.str = sVar16;
    sVar4 = DAT_010b1770;
    RVar7.inst = cashew::SET.inst;
    pcVar2 = DAT_010b1610;
    sVar3 = cashew::HEAPU8;
    pvVar15 = (void *)0x18;
    pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    pVVar9->type = Null;
    cashew::Value::free(pVVar9,pvVar15);
    pVVar9->type = String;
    (pVVar9->field_1).str.str._M_len = sVar3;
    (pVVar9->field_1).str.str._M_str = pcVar2;
    op_14.str._M_str = (char *)pVVar9;
    op_14.str._M_len = sVar4;
    RVar7 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,RVar7,op_14,in_R8);
    uVar14 = SUB81(pVVar9,0);
    cashew::ValueBuilder::appendToBlock(block,RVar7);
  }
  pRVar8 = cashew::Ref::operator[](&local_70,3);
  pVVar11 = pRVar8->inst;
  sVar16 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe416eb),(bool)uVar14);
  pvVar15 = (void *)0x18;
  RVar7.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar7.inst)->type = Null;
  cashew::Value::free(RVar7.inst,pvVar15);
  (RVar7.inst)->type = String;
  ((RVar7.inst)->field_1).str.str = sVar16;
  RVar7 = cashew::ValueBuilder::makeReturn(RVar7);
  cashew::Value::push_back(pVVar11,RVar7);
  cashew::Value::push_back(ast.inst,local_70);
  return;
}

Assistant:

void Wasm2JSBuilder::addMemoryGrowFunc(Ref ast, Module* wasm) {
  Ref memoryGrowFunc = ValueBuilder::makeFunction(WASM_MEMORY_GROW);
  ValueBuilder::appendArgumentToFunction(memoryGrowFunc, IString("pagesToAdd"));

  memoryGrowFunc[3]->push_back(
    ValueBuilder::makeStatement(ValueBuilder::makeBinary(
      ValueBuilder::makeName(IString("pagesToAdd")),
      SET,
      makeJsCoercion(ValueBuilder::makeName(IString("pagesToAdd")),
                     JsType::JS_INT))));

  Ref oldPages = ValueBuilder::makeVar();
  memoryGrowFunc[3]->push_back(oldPages);
  ValueBuilder::appendToVar(
    oldPages,
    IString("oldPages"),
    makeJsCoercion(ValueBuilder::makeCall(WASM_MEMORY_SIZE), JsType::JS_INT));

  Ref newPages = ValueBuilder::makeVar();
  memoryGrowFunc[3]->push_back(newPages);
  ValueBuilder::appendToVar(
    newPages,
    IString("newPages"),
    makeJsCoercion(
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("oldPages")),
                               PLUS,
                               ValueBuilder::makeName(IString("pagesToAdd"))),
      JsType::JS_INT));

  Ref block = ValueBuilder::makeBlock();
  memoryGrowFunc[3]->push_back(ValueBuilder::makeIf(
    ValueBuilder::makeBinary(
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("oldPages")),
                               LT,
                               ValueBuilder::makeName(IString("newPages"))),
      IString("&&"),
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("newPages")),
                               LT,
                               ValueBuilder::makeInt(Memory::kMaxSize32))),
    block,
    NULL));

  Ref newBuffer = ValueBuilder::makeVar();
  ValueBuilder::appendToBlock(block, newBuffer);
  ValueBuilder::appendToVar(
    newBuffer,
    IString("newBuffer"),
    ValueBuilder::makeNew(ValueBuilder::makeCall(
      ARRAY_BUFFER,
      ValueBuilder::makeCall(MATH_IMUL,
                             ValueBuilder::makeName(IString("newPages")),
                             ValueBuilder::makeInt(Memory::kPageSize)))));

  Ref newHEAP8 = ValueBuilder::makeVar();
  ValueBuilder::appendToBlock(block, newHEAP8);
  ValueBuilder::appendToVar(newHEAP8,
                            IString("newHEAP8"),
                            ValueBuilder::makeNew(ValueBuilder::makeCall(
                              ValueBuilder::makeName(INT8ARRAY),
                              ValueBuilder::makeName(IString("newBuffer")))));

  ValueBuilder::appendToBlock(
    block,
    ValueBuilder::makeCall(
      ValueBuilder::makeDot(ValueBuilder::makeName(IString("newHEAP8")),
                            IString("set")),
      ValueBuilder::makeName(HEAP8)));

  auto setHeap = [&](IString name, IString view) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(
        ValueBuilder::makeName(name),
        SET,
        ValueBuilder::makeNew(ValueBuilder::makeCall(
          ValueBuilder::makeName(view),
          ValueBuilder::makeName(IString("newBuffer"))))));
  };

  setHeap(HEAP8, INT8ARRAY);
  setHeap(HEAP16, INT16ARRAY);
  setHeap(HEAP32, INT32ARRAY);
  setHeap(HEAPU8, UINT8ARRAY);
  setHeap(HEAPU16, UINT16ARRAY);
  setHeap(HEAPU32, UINT32ARRAY);
  setHeap(HEAPF32, FLOAT32ARRAY);
  setHeap(HEAPF64, FLOAT64ARRAY);

  ValueBuilder::appendToBlock(
    block,
    ValueBuilder::makeBinary(ValueBuilder::makeName(BUFFER),
                             SET,
                             ValueBuilder::makeName(IString("newBuffer"))));

  // apply the changes to the memory import
  if (!wasm->memories.empty() && wasm->memories[0]->imported()) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(
        ValueBuilder::makeDot(ValueBuilder::makeName("memory"),
                              ValueBuilder::makeName(BUFFER)),
        SET,
        ValueBuilder::makeName(BUFFER)));
  }

  if (needsBufferView(*wasm)) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(ValueBuilder::makeName("bufferView"),
                               SET,
                               ValueBuilder::makeName(HEAPU8)));
  }

  memoryGrowFunc[3]->push_back(
    ValueBuilder::makeReturn(ValueBuilder::makeName(IString("oldPages"))));

  ast->push_back(memoryGrowFunc);
}